

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebBinder.cpp
# Opt level: O2

string * __thiscall WebBinder::getPath(string *__return_storage_ptr__,WebBinder *this,string *path)

{
  pointer ppVar1;
  bool bVar2;
  string *psVar3;
  pointer ppVar4;
  allocator local_b9;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  regex fileRegex;
  regex dirRegex;
  string regexString;
  
  ppVar4 = (this->binds).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->binds).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = __return_storage_ptr__;
  while( true ) {
    psVar3 = local_b8;
    if (ppVar4 == ppVar1) {
      std::__cxx11::string::string((string *)local_b8,"",(allocator *)&regexString);
      return psVar3;
    }
    std::__cxx11::string::string((string *)&regexString,(string *)ppVar4);
    std::__cxx11::string::string((string *)&fileRegex,"*",(allocator *)&local_b0);
    psVar3 = (string *)&dirRegex;
    std::__cxx11::string::string((string *)&dirRegex,"(\\w)+",&local_b9);
    replaceAll((WebBinder *)psVar3,&regexString,(string *)&fileRegex,(string *)&dirRegex);
    std::__cxx11::string::~string((string *)&dirRegex);
    std::__cxx11::string::~string((string *)&fileRegex);
    std::__cxx11::string::string((string *)&fileRegex,"/",(allocator *)&local_b0);
    psVar3 = (string *)&dirRegex;
    std::__cxx11::string::string((string *)&dirRegex,"\\/",&local_b9);
    replaceAll((WebBinder *)psVar3,&regexString,(string *)&fileRegex,(string *)&dirRegex);
    std::__cxx11::string::~string((string *)&dirRegex);
    std::__cxx11::string::~string((string *)&fileRegex);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&fileRegex,&regexString,0x10);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (path,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&fileRegex,0);
    if (bVar2) break;
    std::__cxx11::string::append((char *)&regexString);
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&dirRegex,&regexString,0x10);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (path,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&dirRegex,0);
    if (bVar2) {
      std::__cxx11::string::find_last_of((char *)path,0x135017);
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)path);
      std::operator+(local_b8,&ppVar4->second,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&dirRegex);
      goto LAB_00127374;
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&dirRegex);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&fileRegex);
    std::__cxx11::string::~string((string *)&regexString);
    ppVar4 = ppVar4 + 1;
  }
  std::__cxx11::string::string((string *)local_b8,(string *)&ppVar4->second);
LAB_00127374:
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&fileRegex);
  std::__cxx11::string::~string((string *)&regexString);
  return local_b8;
}

Assistant:

std::string WebBinder::getPath(std::string path) {
  
  for (auto &pair : binds) {
    std::string regexString(pair.first);
    replaceAll(regexString, "*", "(\\w)+");
    replaceAll(regexString, "/", "\\/");
    std::regex fileRegex(regexString);
    
    if (std::regex_match(path, fileRegex)) 
      return pair.second;
    
    regexString.append("(\\w)+(\\.(\\w)+)?");
    std::regex dirRegex(regexString);
    if (std::regex_match(path, dirRegex)) 
      return pair.second + path.substr(path.find_last_of("/") + 1, path.length());
  }
  
  return "";
}